

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReaderCache::purgeAll(PtexReaderCache *this)

{
  size_t in_RDI;
  PtexReaderCache *unaff_retaddr;
  Purger purger;
  Purger local_10;
  
  Purger::Purger(&local_10);
  PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::
  foreach<Ptex::v2_2::PtexReaderCache::Purger>
            ((PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *)this,
             (Purger *)purger.memUsedChangeTotal);
  adjustMemUsed(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void PtexReaderCache::purgeAll()
{
    Purger purger;
    _files.foreach(purger);
    adjustMemUsed(purger.memUsedChangeTotal);
}